

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarrayblk.c
# Opt level: O3

void tommy_arrayblk_init(tommy_arrayblk *array)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  void **ppvVar4;
  long lVar5;
  long in_FS_OFFSET;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (array->block).bucket_bit = 6;
  (array->block).bucket_max = 0x40;
  ppvVar4 = (void **)lrtr_calloc(0x40,8);
  (array->block).bucket[0] = ppvVar4;
  auVar3 = _DAT_00116a50;
  auVar2 = _DAT_00116a40;
  lVar5 = 0;
  iVar6 = (int)DAT_00116a60;
  iVar7 = DAT_00116a60._4_4_;
  do {
    auVar8._8_4_ = (int)lVar5;
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar8 = (auVar8 | auVar2) ^ auVar3;
    if (auVar8._4_4_ == iVar7 && auVar8._0_4_ < iVar6) {
      (array->block).bucket[lVar5 + 1] = ppvVar4;
      (array->block).bucket[lVar5 + 2] = ppvVar4;
    }
    lVar5 = lVar5 + 2;
  } while (lVar5 != 6);
  (array->block).count = 0;
  array->count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void tommy_arrayblk_init(tommy_arrayblk* array)
{
	tommy_array_init(&array->block);

	array->count = 0;
}